

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall
SVGChart::LogTickIterator::AdjustRange(LogTickIterator *this,float *ioMin,float *ioMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long theLogFac;
  float theBase;
  float *ioMax_local;
  float *ioMin_local;
  LogTickIterator *this_local;
  
  fVar3 = ((this->super_TickIterator).mAxisSetup)->mLogBase;
  if (0 < ((this->super_TickIterator).mAxisSetup)->mMaxDecades) {
    fVar2 = *ioMax;
    fVar1 = SafeExp((float)((this->super_TickIterator).mAxisSetup)->mMaxDecades,fVar3,1.0);
    *ioMin = fVar2 / fVar1;
  }
  if ((((*ioMin == 0.0) && (!NAN(*ioMin))) && (*ioMax == 0.0)) && (!NAN(*ioMax))) {
    *ioMin = 1e-10;
    *ioMax = 1.0;
  }
  if ((*ioMin <= 0.0) || (*ioMax <= 0.0)) {
    this_local._7_1_ = false;
  }
  else {
    fVar2 = RoundDown(this,*ioMin * 1.0001);
    *ioMin = fVar2;
    fVar2 = RoundUp(this,*ioMax * 0.9999);
    *ioMax = fVar2;
    if (*ioMin <= 1e-10 && *ioMin != 1e-10) {
      *ioMin = 1e-10;
    }
    if (0 < ((this->super_TickIterator).mAxisSetup)->mMaxDecades) {
      fVar2 = *ioMax;
      fVar3 = SafeExp((float)((this->super_TickIterator).mAxisSetup)->mMaxDecades,fVar3,1.0);
      *ioMin = fVar2 / fVar3;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LogTickIterator::AdjustRange (float &ioMin, float &ioMax) const {

      float theBase = mAxisSetup->mLogBase;
      long theLogFac = 1;//mAxisSetup->mLogFactor;
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      if (ioMin == 0 && ioMax == 0) {
          ioMin = kLogMinClipValue;
          ioMax = 1.0f;
      }
      if (ioMin <= 0 || ioMax<=0) {
        return false;
      }
      ioMin = RoundDown (ioMin*kLittleIncrease);
      ioMax = RoundUp (ioMax*kLittleDecrease);

      if (ioMin<kLogMinClipValue) {
        ioMin = kLogMinClipValue;
      }
      if (mAxisSetup->mMaxDecades > 0) {
        ioMin = ioMax/SafeExp (mAxisSetup->mMaxDecades, theBase, theLogFac);
      }
      return true;
    }